

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void * __thiscall
google::protobuf::internal::GeneratedMessageReflection::RepeatedFieldData
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,CppType cpp_type
          ,Descriptor *message_type)

{
  int number;
  bool packed;
  CppType CVar1;
  uint32 uVar2;
  Type TVar3;
  LogMessage *pLVar4;
  Descriptor *pDVar5;
  void *pvVar6;
  LogFinisher local_69;
  LogMessage local_68;
  
  if (*(int *)(field + 0x4c) != 3) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x899);
    pLVar4 = LogMessage::operator<<(&local_68,"CHECK failed: field->is_repeated(): ");
    LogFinisher::operator=(&local_69,pLVar4);
    LogMessage::~LogMessage(&local_68);
  }
  CVar1 = FieldDescriptor::cpp_type(field);
  if (CVar1 != cpp_type) {
    CVar1 = FieldDescriptor::cpp_type(field);
    if (cpp_type != CPPTYPE_INT32 || CVar1 != CPPTYPE_ENUM) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x89c);
      pLVar4 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: field->cpp_type() == cpp_type || (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM && cpp_type == FieldDescriptor::CPPTYPE_INT32): "
                         );
      pLVar4 = LogMessage::operator<<
                         (pLVar4,"The type parameter T in RepeatedFieldRef<T> API doesn\'t match ");
      pLVar4 = LogMessage::operator<<
                         (pLVar4,"the actual field type (for enums T should be the generated enum ")
      ;
      pLVar4 = LogMessage::operator<<(pLVar4,"type or int32).");
      LogFinisher::operator=(&local_69,pLVar4);
      LogMessage::~LogMessage(&local_68);
    }
  }
  if (message_type != (Descriptor *)0x0) {
    pDVar5 = FieldDescriptor::message_type(field);
    if (pDVar5 != message_type) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x8a1);
      pLVar4 = LogMessage::operator<<
                         (&local_68,"CHECK failed: (message_type) == (field->message_type()): ");
      LogFinisher::operator=(&local_69,pLVar4);
      LogMessage::~LogMessage(&local_68);
    }
  }
  if (field[0x50] == (FieldDescriptor)0x1) {
    uVar2 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    number = *(int *)(field + 0x38);
    TVar3 = FieldDescriptor::type(field);
    packed = FieldDescriptor::is_packed(field);
    pvVar6 = ExtensionSet::MutableRawRepeatedField
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                        number,(FieldType)TVar3,packed,field);
  }
  else {
    uVar2 = ReflectionSchema::GetFieldOffsetNonOneof(&this->schema_,field);
    pvVar6 = (void *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2);
  }
  return pvVar6;
}

Assistant:

void* GeneratedMessageReflection::RepeatedFieldData(
    Message* message, const FieldDescriptor* field,
    FieldDescriptor::CppType cpp_type,
    const Descriptor* message_type) const {
  GOOGLE_CHECK(field->is_repeated());
  GOOGLE_CHECK(field->cpp_type() == cpp_type ||
        (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM &&
         cpp_type == FieldDescriptor::CPPTYPE_INT32))
      << "The type parameter T in RepeatedFieldRef<T> API doesn't match "
      << "the actual field type (for enums T should be the generated enum "
      << "type or int32).";
  if (message_type != NULL) {
    GOOGLE_CHECK_EQ(message_type, field->message_type());
  }
  if (field->is_extension()) {
    return MutableExtensionSet(message)->MutableRawRepeatedField(
        field->number(), field->type(), field->is_packed(), field);
  } else {
    return MutableRawNonOneof<char>(message, field);
  }
}